

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

shared_ptr<const_helics::SmallBuffer> * __thiscall
helics::CommonCore::getValue(CommonCore *this,InterfaceHandle handle,uint32_t *inputIndex)

{
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar1;
  FederateState *this_00;
  shared_ptr<const_helics::SmallBuffer> *psVar2;
  InvalidIdentifier *this_01;
  char *pcVar3;
  size_t sVar4;
  string_view message;
  
  puVar1 = getHandleInfo(this,handle);
  if (puVar1 == (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle is invalid (getValue)";
    sVar4 = 0x1c;
  }
  else {
    if (*(char *)((long)&puVar1[1]._M_t.
                         super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                         .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4) ==
        'i') {
      this_00 = getFederateAt(this,(LocalFederateId)
                                   *(BaseType *)
                                    &puVar1[1]._M_t.
                                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>.
                                     _M_head_impl);
      FederateState::sleeplock(this_00);
      psVar2 = FederateState::getValue(this_00,handle,inputIndex);
      LOCK();
      (this_00->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
      return psVar2;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle does not identify an input";
    sVar4 = 0x21;
  }
  message._M_str = pcVar3;
  message._M_len = sVar4;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

const std::shared_ptr<const SmallBuffer>& CommonCore::getValue(InterfaceHandle handle,
                                                               uint32_t* inputIndex)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle is invalid (getValue)"));
    }

    if (handleInfo->handleType != InterfaceType::INPUT) {
        throw(InvalidIdentifier("Handle does not identify an input"));
    }
    auto& fed = *getFederateAt(handleInfo->local_fed_id);
    const std::lock_guard<FederateState> lock(fed);
    return fed.getValue(handle, inputIndex);
}